

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O1

string * anon_unknown.dwarf_3ac2::sanitize(string *__return_storage_ptr__,string *s)

{
  size_type sVar1;
  size_type sVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = s->_M_string_length;
  if (sVar1 != 0) {
    sVar2 = 0;
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string sanitize(const std::string &s) {
  std::string result;
  for (std::string::const_iterator i = s.begin(), end = s.end(); i != end; ++i)
    result.push_back(static_cast<char>(*i & 0xff));
  return result;
}